

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O2

void vera::extractMesh(Model *_model,Mesh *_mesh,mat4 _matrix,Scene *_scene,bool _verbose)

{
  Accessor *this;
  BufferView *bufferViewObject;
  int iVar1;
  pointer pAVar2;
  pointer pBVar3;
  pointer pBVar4;
  Mesh *pMVar5;
  bool bVar6;
  uint32_t byteStride;
  int iVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  const_reference pvVar10;
  Material *_mat;
  Model *this_00;
  mapped_type *ppMVar11;
  uint uVar12;
  undefined7 in_register_00000009;
  ulong uVar13;
  size_t v;
  pointer pPVar14;
  Primitive *_primitive;
  ulong uVar15;
  col_type cVar16;
  vec<3,_float,_(glm::qualifier)0> vVar17;
  col_type cVar18;
  vec3 local_170;
  uint local_164;
  Scene *local_160;
  Mesh *local_158;
  _Base_ptr local_150;
  ModelsMap *local_148;
  Primitive *local_140;
  _Base_ptr local_138;
  vec<3,_float,_(glm::qualifier)0> local_130;
  Mesh mesh;
  vec4 tan;
  mat3 normalMatrix;
  
  uVar12 = (uint)CONCAT71(in_register_00000009,_verbose);
  local_160 = _scene;
  if (uVar12 != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"  Parsing Mesh ");
    poVar8 = std::operator<<(poVar8,(string *)_mesh);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
            ((mat<3,_3,_float,_(glm::qualifier)0> *)&tan,&_matrix);
  glm::detail::compute_inverse<3,_3,_float,_(glm::qualifier)0,_false>::call
            ((mat<3,_3,_float,_(glm::qualifier)0> *)&tan);
  glm::detail::compute_transpose<3,_3,_float,_(glm::qualifier)0,_false>::call
            (&normalMatrix,(mat<3,_3,_float,_(glm::qualifier)0> *)&mesh);
  local_148 = &local_160->models;
  uVar13 = 0;
  local_164 = uVar12 & 0xff;
  local_158 = _mesh;
  do {
    pMVar5 = local_158;
    pPVar14 = (local_158->primitives).
              super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_158->primitives).
                       super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar14) / 0x120) <=
        uVar13) {
      return;
    }
    if (_verbose) {
      poVar8 = std::operator<<((ostream *)&std::cout,"   primitive ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,"/");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      pPVar14 = (pMVar5->primitives).
                super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    Mesh::Mesh(&mesh);
    if (-1 < (long)pPVar14[uVar13].indices) {
      extractIndices(_model,(_model->accessors).
                            super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
                            ._M_impl.super__Vector_impl_data._M_start + pPVar14[uVar13].indices,
                     &mesh);
    }
    _primitive = pPVar14 + uVar13;
    mesh.m_drawMode = extractMode(_primitive);
    local_138 = &(_primitive->attributes)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var9 = (_primitive->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_140 = _primitive;
    while (p_Var9 != local_138) {
      pAVar2 = (_model->accessors).
               super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar3 = (_model->bufferViews).
               super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this = pAVar2 + (int)p_Var9[2]._M_color;
      iVar1 = pAVar2[(int)p_Var9[2]._M_color].bufferView;
      bufferViewObject = pBVar3 + iVar1;
      iVar1 = pBVar3[iVar1].buffer;
      pBVar4 = (_model->buffers).
               super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_150 = p_Var9;
      byteStride = tinygltf::Accessor::ByteStride(this,bufferViewObject);
      p_Var9 = local_150 + 1;
      iVar7 = std::__cxx11::string::compare((char *)p_Var9);
      if (iVar7 == 0) {
        for (uVar15 = 0; uVar15 < this->count; uVar15 = uVar15 + 1) {
          tan.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x3f800000;
          tan.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
          tan.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
          tan.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
          pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&pBVar4[iVar1].data,this->byteOffset + bufferViewObject->byteOffset);
          extractVertexData((uint32_t)uVar15,pvVar10,this->componentType,this->type,false,byteStride
                            ,(float *)&tan,'\x03');
          cVar18 = glm::operator*(&_matrix,&tan);
          local_170._0_8_ = cVar18._0_8_;
          local_170.field_2 =
               (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)cVar18.field_2;
          Mesh::addVertex(&mesh,&local_170);
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)p_Var9);
        if (iVar7 == 0) {
          for (uVar15 = 0; uVar15 < this->count; uVar15 = uVar15 + 1) {
            tan.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x3f800000
            ;
            tan.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000
            ;
            tan.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000
            ;
            tan.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000
            ;
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (&pBVar4[iVar1].data,this->byteOffset + bufferViewObject->byteOffset
                                );
            extractVertexData((uint32_t)uVar15,pvVar10,this->componentType,this->type,false,
                              byteStride,(float *)&tan,'\x04');
            Mesh::addColor(&mesh,&tan);
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)p_Var9);
          if (iVar7 == 0) {
            for (uVar15 = 0; uVar15 < this->count; uVar15 = uVar15 + 1) {
              pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  (&pBVar4[iVar1].data,
                                   this->byteOffset + bufferViewObject->byteOffset);
              extractVertexData((uint32_t)uVar15,pvVar10,this->componentType,this->type,false,
                                byteStride,(float *)&tan,'\x03');
              cVar16 = glm::operator*(&normalMatrix,(row_type *)&tan);
              local_130.field_2 = cVar16.field_2;
              local_130._0_8_ = cVar16._0_8_;
              vVar17 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                                 (&local_130);
              local_170.field_2 = vVar17.field_2;
              local_170._0_8_ = vVar17._0_8_;
              Mesh::addNormal(&mesh,&local_170);
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)p_Var9);
            if (iVar7 == 0) {
              for (uVar15 = 0; uVar15 < this->count; uVar15 = uVar15 + 1) {
                pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&pBVar4[iVar1].data,
                                     this->byteOffset + bufferViewObject->byteOffset);
                extractVertexData((uint32_t)uVar15,pvVar10,this->componentType,this->type,false,
                                  byteStride,(float *)&tan,'\x02');
                Mesh::addTexCoord(&mesh,(vec2 *)&tan);
              }
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)p_Var9);
              if (iVar7 == 0) {
                for (uVar15 = 0; uVar15 < this->count; uVar15 = uVar15 + 1) {
                  pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      (&pBVar4[iVar1].data,
                                       this->byteOffset + bufferViewObject->byteOffset);
                  extractVertexData((uint32_t)uVar15,pvVar10,this->componentType,this->type,false,
                                    byteStride,(float *)&tan,'\x04');
                  Mesh::addTangent(&mesh,&tan);
                }
              }
              else {
                poVar8 = std::operator<<((ostream *)&std::cout," ");
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"Attribute: ");
                poVar8 = std::operator<<(poVar8,(string *)p_Var9);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"  type        :");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->type);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"  component   :");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->componentType);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"  normalize   :");
                poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"  bufferView  :");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->bufferView);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"  byteOffset  :");
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"  count       :");
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout,"  byteStride  :");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,byteStride);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)&std::cout," ");
                std::endl<char,std::char_traits<char>>(poVar8);
              }
            }
          }
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_150);
    }
    if (_verbose) {
      poVar8 = std::operator<<((ostream *)&std::cout,"    vertices = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"    colors   = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"    normals  = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"    uvs      = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"    indices  = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      if (mesh.m_drawMode == LINES) {
        poVar8 = std::operator<<((ostream *)&std::cout,"    lines    = ");
      }
      else {
        if (mesh.m_drawMode != TRIANGLES) goto LAB_00284d6b;
        poVar8 = std::operator<<((ostream *)&std::cout,"    triang.  = ");
      }
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
LAB_00284d6b:
    if (mesh.m_normals.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        mesh.m_normals.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar6 = Mesh::computeNormals(&mesh);
      if (bVar6 && _verbose) {
        poVar8 = std::operator<<((ostream *)&std::cout,"    . Compute normals");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    bVar6 = Mesh::computeTangents(&mesh);
    if (bVar6 && _verbose) {
      poVar8 = std::operator<<((ostream *)&std::cout,"    . Compute tangents");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    _mat = extractMaterial(_model,(_model->materials).
                                  super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_140->material,
                           local_160,SUB41(local_164,0));
    this_00 = (Model *)operator_new(0x2d8);
    pMVar5 = local_158;
    Model::Model(this_00,&local_158->name,&mesh,_mat);
    ppMVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
               ::operator[](local_148,&pMVar5->name);
    *ppMVar11 = this_00;
    Mesh::~Mesh(&mesh);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void extractMesh(const tinygltf::Model& _model, const tinygltf::Mesh& _mesh, glm::mat4 _matrix, Scene* _scene, bool _verbose) {
    if (_verbose)
        std::cout << "  Parsing Mesh " << _mesh.name << std::endl;

    glm::mat3 normalMatrix = glm::transpose(glm::inverse(glm::mat3(_matrix)));

    for (size_t i = 0; i < _mesh.primitives.size(); ++i) {
        if (_verbose)
            std::cout << "   primitive " << i + 1 << "/" << _mesh.primitives.size() << std::endl;

        const tinygltf::Primitive &primitive = _mesh.primitives[i];

        Mesh mesh;
        if (primitive.indices >= 0)
            extractIndices(_model, _model.accessors[primitive.indices], mesh);
        mesh.setDrawMode(extractMode(primitive));

        // Extract Vertex Data
        for (auto &attrib : primitive.attributes) {
            const tinygltf::Accessor &accessor = _model.accessors[attrib.second];
            const tinygltf::BufferView &bufferView = _model.bufferViews[accessor.bufferView];
            const tinygltf::Buffer &buffer = _model.buffers[bufferView.buffer];
            int byteStride = accessor.ByteStride(bufferView);

            if (attrib.first.compare("POSITION") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 pos = glm::vec4(1.0);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &pos[0], 3);
                    mesh.addVertex( glm::vec3(_matrix * pos) );
                }
            }

            else if (attrib.first.compare("COLOR_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 col = glm::vec4(1.0f);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &col[0], 4);
                    mesh.addColor(col);
                }
            }

            else if (attrib.first.compare("NORMAL") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec3 nor;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &nor[0], 3);
                    mesh.addNormal( normalize(normalMatrix * nor) );
                }
            }

            else if (attrib.first.compare("TEXCOORD_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec2 uv;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &uv[0], 2);
                    mesh.addTexCoord(uv);
                }
            }

            else if (attrib.first.compare("TANGENT") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 tan;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &tan[0], 4);
                    mesh.addTangent(tan);
                }
            }

            else {
                std::cout << " " << std::endl;
                std::cout << "Attribute: " << attrib.first << std::endl;
                std::cout << "  type        :" << accessor.type << std::endl;
                std::cout << "  component   :" << accessor.componentType << std::endl;
                std::cout << "  normalize   :" << accessor.normalized << std::endl;
                std::cout << "  bufferView  :" << accessor.bufferView << std::endl;
                std::cout << "  byteOffset  :" << accessor.byteOffset << std::endl;
                std::cout << "  count       :" << accessor.count << std::endl;
                std::cout << "  byteStride  :" << byteStride << std::endl;
                std::cout << " "<< std::endl;
            }
        }

        if (_verbose) {
            std::cout << "    vertices = " << mesh.getVertices().size() << std::endl;
            std::cout << "    colors   = " << mesh.getColors().size() << std::endl;
            std::cout << "    normals  = " << mesh.getNormals().size() << std::endl;
            std::cout << "    uvs      = " << mesh.getTexCoords().size() << std::endl;
            std::cout << "    indices  = " << mesh.getIndices().size() << std::endl;

            if (mesh.getDrawMode() == GL_TRIANGLES) {
                std::cout << "    triang.  = " << mesh.getIndices().size()/3 << std::endl;
            }
            else if (mesh.getDrawMode() == GL_LINES ) {
                std::cout << "    lines    = " << mesh.getIndices().size()/2 << std::endl;
            }
        }

        if ( !mesh.haveNormals() )
            if ( mesh.computeNormals() )
                if ( _verbose )
                    std::cout << "    . Compute normals" << std::endl;

        if ( mesh.computeTangents() )
            if ( _verbose )
                std::cout << "    . Compute tangents" << std::endl;

        Material* mat = extractMaterial( _model, _model.materials[primitive.material], _scene, _verbose );
        _scene->models[_mesh.name] = new Model(_mesh.name, mesh, mat);
    }
}